

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

fitsfile *
ffhist3(fitsfile *fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
       char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int *in_RDI;
  int *in_R9;
  double *in_XMM0_Qa;
  int *in_stack_00000020;
  int *in_stack_00000028;
  char *in_stack_00000030;
  int in_stack_00000038;
  double weight;
  double binsize [4];
  double amax [4];
  double amin [4];
  long haxes [4];
  int wtcolnum;
  int colnum [4];
  int bitpix;
  fitsfile *histptr;
  int *in_stack_000005e8;
  int *in_stack_000005f0;
  int in_stack_000005f8;
  int in_stack_000005fc;
  fitsfile *in_stack_00000600;
  fitsfile *in_stack_00000608;
  int *in_stack_00000748;
  char *in_stack_00000750;
  fitsfile **in_stack_00000758;
  int *status_00;
  fitsfile *histptr_00;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  fitsfile *fptr_02;
  double *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  long *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  fitsfile *in_stack_ffffffffffffff00;
  fitsfile *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  fitsfile *in_stack_ffffffffffffff20;
  fitsfile local_d8;
  double *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  FITSfile *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char (*in_stack_ffffffffffffff68) [71];
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  fitsfile *in_stack_ffffffffffffff78;
  long *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  fitsfile *in_stack_ffffffffffffff90;
  fitsfile *local_38;
  
  if (*(int *)weight < 1) {
    if (in_ECX < 5) {
      if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        ffmahd((fitsfile *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff14,&in_stack_ffffffffffffff08->HDUposition,
               &in_stack_ffffffffffffff00->HDUposition);
      }
      if (in_EDX == 0xb) {
        uVar3 = 8;
      }
      else if (in_EDX == 0x15) {
        uVar3 = 0x10;
      }
      else if (in_EDX == 0x1f) {
        uVar3 = 0x20;
      }
      else if (in_EDX == 0x2a) {
        uVar3 = 0xffffffe0;
      }
      else {
        if (in_EDX != 0x52) {
          *(undefined4 *)weight = 0x19a;
          return (fitsfile *)0x0;
        }
        uVar3 = 0xffffffc0;
      }
      status_00 = (int *)&stack0xffffffffffffff78;
      histptr_00 = (fitsfile *)&stack0xffffffffffffff48;
      fptr_00 = &local_d8;
      fptr_01 = (fitsfile *)&stack0xffffffffffffff08;
      iVar2 = (int)((ulong)&stack0xfffffffffffffee8 >> 0x20);
      fptr_02 = (fitsfile *)weight;
      iVar1 = fits_calc_binningd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                 (char (*) [71])
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                 (double *)in_stack_ffffffffffffff08,
                                 (double *)in_stack_ffffffffffffff00,
                                 (double *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                 (char (*) [71])
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff68,
                                 (char (*) [71])
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 &in_stack_ffffffffffffff78->HDUposition,in_stack_ffffffffffffff80,
                                 (double *)CONCAT44(uVar3,in_stack_ffffffffffffff88),
                                 (double *)in_stack_ffffffffffffff90,in_XMM0_Qa,in_R9);
      if (iVar1 < 1) {
        if ((*in_stack_00000030 != '\0') &&
           (iVar2 = ffgky(fptr_02,iVar2,(char *)fptr_01,fptr_00,(char *)histptr_00,status_00),
           in_XMM0_Qa = in_stack_fffffffffffffee0, iVar2 != 0)) {
          *(undefined4 *)weight = 0;
          iVar2 = ffgcno(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                         (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (int *)in_stack_fffffffffffffee0);
          if (0 < iVar2) {
            ffpmsg((char *)0x1d9bdc);
            ffpmsg((char *)0x1d9be9);
            return (fitsfile *)0x0;
          }
          in_XMM0_Qa = (double *)0xb8a83e285ebab4b7;
        }
        if ((0.0 < (double)in_XMM0_Qa) ||
           (((double)in_XMM0_Qa == -9.1191291391491e-36 && (!NAN((double)in_XMM0_Qa))))) {
          if ((in_stack_00000038 != 0) &&
             (((double)in_XMM0_Qa != -9.1191291391491e-36 || (NAN((double)in_XMM0_Qa))))) {
            in_XMM0_Qa = (double *)(1.0 / (double)in_XMM0_Qa);
          }
          iVar2 = ffinit(in_stack_00000758,in_stack_00000750,in_stack_00000748);
          if (iVar2 < 1) {
            iVar2 = ffcrim(fptr_01,(int)((ulong)fptr_00 >> 0x20),(int)fptr_00,(long *)histptr_00,
                           status_00);
            iVar1 = (int)((ulong)status_00 >> 0x20);
            if (iVar2 < 1) {
              iVar2 = fits_copy_pixlist2image
                                (in_stack_00000608,in_stack_00000600,in_stack_000005fc,
                                 in_stack_000005f8,in_stack_000005f0,in_stack_000005e8);
              if (iVar2 < 1) {
                fits_write_keys_histo(fptr_00,histptr_00,iVar1,in_stack_00000028,in_stack_00000020);
                fits_rebin_wcsd(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                                (double *)in_stack_ffffffffffffff68,
                                (double *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                               );
                iVar2 = fits_make_histd(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                        in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                                        in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                                        (double *)in_stack_ffffffffffffff50,(double)in_XMM0_Qa,
                                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
                                        *in_stack_ffffffffffffff68,
                                        (int *)CONCAT44(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70));
                local_38 = in_stack_ffffffffffffff90;
                if (0 < iVar2) {
                  ffpmsg((char *)0x1d9e6d);
                  local_38 = (fitsfile *)0x0;
                }
              }
              else {
                ffpmsg((char *)0x1d9d6b);
                local_38 = (fitsfile *)0x0;
              }
            }
            else {
              ffpmsg((char *)0x1d9d18);
              local_38 = (fitsfile *)0x0;
            }
          }
          else {
            ffpmsg((char *)0x1d9ccb);
            local_38 = (fitsfile *)0x0;
          }
        }
        else {
          ffpmsg((char *)0x1d9c48);
          *(undefined4 *)weight = 0x7d;
          local_38 = (fitsfile *)0x0;
        }
      }
      else {
        ffpmsg((char *)0x1d9b43);
        local_38 = (fitsfile *)0x0;
      }
    }
    else {
      ffpmsg((char *)0x1d9993);
      *(undefined4 *)weight = 0x140;
      local_38 = (fitsfile *)0x0;
    }
  }
  else {
    local_38 = (fitsfile *)0x0;
  }
  return local_38;
}

Assistant:

fitsfile *ffhist3(fitsfile *fptr, /* I - ptr to table with X and Y cols*/
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    fitsfile *histptr;
    int   bitpix, colnum[4], wtcolnum;
    long haxes[4];
    double amin[4], amax[4], binsize[4],  weight;

    if (*status > 0)
        return(NULL);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
	*status = BAD_DIMEN;
        return(NULL);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else{
        *status = BAD_DATATYPE;
        return(NULL);
    }
    
    /*    Calculate the binning parameters:    */
    /*   columm numbers, axes length, min values,  max values, and binsizes.  */

    if (fits_calc_binningd(
      fptr, naxis, colname, minin, maxin, binsizein, minname, maxname, binname,
      colnum, haxes, amin, amax, binsize, status) > 0)
    {
       ffpmsg("failed to determine binning parameters");
        return(NULL);
    }
 
    /* get the histogramming weighting factor, if any */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (fits_read_key(fptr, TDOUBLE, wtcol, &weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(fptr, CASEINSEN, wtcol, &wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(NULL);
            }

            weight = DOUBLENULLVALUE;
        }
    }
    else
        weight = (double) weightin;

    if (weight <= 0. && weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
	*status = URL_PARSE_ERROR;
        return(NULL);
    }

    if (recip && weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       weight = (double) (1.0 / weight);

    /* size of histogram is now known, so create temp output file */
    if (fits_create_file(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(NULL);
    }

    /* create output FITS image HDU */
    if (ffcrim(histptr, bitpix, naxis, haxes, status) > 0)
    {
        ffpmsg("failed to create output histogram FITS image");
        return(NULL);
    }

    /* copy header keywords, converting pixel list WCS keywords to image WCS */
    if (fits_copy_pixlist2image(fptr, histptr, 9, naxis, colnum, status) > 0)
    {
        ffpmsg("failed to copy pixel list keywords to new histogram header");
        return(NULL);
    }

    /* if the table columns have no WCS keywords, then write default keywords */
    fits_write_keys_histo(fptr, histptr, naxis, colnum, status);
    
    /* update the WCS keywords for the ref. pixel location, and pixel size */
    fits_rebin_wcsd(histptr, naxis, amin, binsize,  status);      
    
    /* now compute the output image by binning the column values */
    if (fits_make_histd(fptr, histptr, bitpix, naxis, haxes, colnum, amin, amax,
        binsize, weight, wtcolnum, recip, selectrow, status) > 0)
    {
        ffpmsg("failed to calculate new histogram values");
        return(NULL);
    }
              
    return(histptr);
}